

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_write_split(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_cipher_mode_t mVar1;
  int iVar2;
  int ret;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  if (((((*(uint *)&ssl->conf->field_0x164 >> 0xd & 1) == 0) || (len < 2)) || (1 < ssl->minor_ver))
     || (mVar1 = mbedtls_cipher_get_cipher_mode(&ssl->transform_out->cipher_ctx_enc),
        mVar1 != MBEDTLS_MODE_CBC)) {
    ssl_local._4_4_ = ssl_write_real(ssl,buf,len);
  }
  else {
    if (ssl->split_done == '\0') {
      iVar2 = ssl_write_real(ssl,buf,1);
      if (iVar2 < 1) {
        return iVar2;
      }
      ssl->split_done = '\x01';
    }
    ssl_local._4_4_ = ssl_write_real(ssl,buf + 1,len - 1);
    if (0 < ssl_local._4_4_) {
      ssl->split_done = '\0';
      ssl_local._4_4_ = ssl_local._4_4_ + 1;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_write_split( mbedtls_ssl_context *ssl,
                            const unsigned char *buf, size_t len )
{
    int ret;

    if( ssl->conf->cbc_record_splitting ==
            MBEDTLS_SSL_CBC_RECORD_SPLITTING_DISABLED ||
        len <= 1 ||
        ssl->minor_ver > MBEDTLS_SSL_MINOR_VERSION_1 ||
        mbedtls_cipher_get_cipher_mode( &ssl->transform_out->cipher_ctx_enc )
                                != MBEDTLS_MODE_CBC )
    {
        return( ssl_write_real( ssl, buf, len ) );
    }

    if( ssl->split_done == 0 )
    {
        if( ( ret = ssl_write_real( ssl, buf, 1 ) ) <= 0 )
            return( ret );
        ssl->split_done = 1;
    }

    if( ( ret = ssl_write_real( ssl, buf + 1, len - 1 ) ) <= 0 )
        return( ret );
    ssl->split_done = 0;

    return( ret + 1 );
}